

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O2

int Gia_ManTerRetire(Gia_ManTer_t *p,uint *pThis,uint *pPrev)

{
  int iVar1;
  uint Entry;
  int i;
  byte bVar2;
  
  p->vRetired->nSize = 0;
  bVar2 = 0;
  for (Entry = 0; (int)Entry < p->pAig->nRegs; Entry = Entry + 1) {
    if (((pPrev[Entry >> 4] ^ pThis[Entry >> 4]) >> (bVar2 & 0x1e) & 3) != 0) {
      Vec_IntPush(p->vRetired,Entry);
    }
    bVar2 = bVar2 + 2;
  }
  i = 0;
  while( true ) {
    iVar1 = p->vRetired->nSize;
    if (iVar1 <= i) break;
    iVar1 = Vec_IntEntry(p->vRetired,i);
    Gia_ManTerSimInfoSet(p->pDataSimCis,(iVar1 + p->pAig->vCis->nSize) - p->pAig->nRegs,3);
    i = i + 1;
  }
  return iVar1;
}

Assistant:

int Gia_ManTerRetire( Gia_ManTer_t * p, unsigned * pThis, unsigned * pPrev )
{
    int i, Entry;
    // find registers whose value has changed
    Vec_IntClear( p->vRetired );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( Gia_ManTerSimInfoGet( pThis, i ) != Gia_ManTerSimInfoGet( pPrev, i ) )
            Vec_IntPush( p->vRetired, i );
    // set all of them to zero
    Vec_IntForEachEntry( p->vRetired, Entry, i )
        Gia_ManTerSimInfoSet( p->pDataSimCis, Gia_ManPiNum(p->pAig)+Entry, GIA_UND );
    return Vec_IntSize(p->vRetired);
}